

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator+(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  int64_t iVar1;
  int64_t iVar2;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<Fad<float>_> *in_RDI;
  TPZFMatrix<Fad<float>_> *in_stack_00000018;
  TPZFMatrix<Fad<float>_> *in_stack_00000020;
  Fad<float> *dstlast;
  Fad<float> *dst;
  int64_t size;
  TPZFMatrix<Fad<float>_> *res;
  Fad<float> *x;
  Fad<float> *this_00;
  
  TPZFMatrix(in_stack_00000020,in_stack_00000018);
  iVar1 = TPZBaseMatrix::Rows(in_RSI);
  iVar2 = TPZBaseMatrix::Cols(in_RSI);
  this_00 = in_RDI->fElem;
  x = this_00 + iVar1 * iVar2;
  while (this_00 < x) {
    this_00 = this_00 + 1;
    Fad<float>::operator+=<float,_nullptr>(this_00,x);
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator+(const TVar value ) const {
    TPZFMatrix<TVar> res( *this );
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = res.fElem,  *dstlast = dst+size;
    while ( dst < dstlast )
        *dst++ += value;
    
    return( res );
}